

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mtmsr(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 msr;
  TCGTemp *ts;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
      gen_io_start(tcg_ctx);
    }
    uVar1 = ctx->opcode;
    ret = tcg_temp_new_i64(tcg_ctx);
    ts = (TCGTemp *)(ret + (long)&tcg_ctx->pool_cur);
    if ((uVar1 >> 0x10 & 1) == 0) {
      gen_update_nip(ctx,(ctx->base).pc_next);
      tcg_gen_deposit_i64_ppc64
                (tcg_ctx,ret,cpu_msr,
                 *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),0,0x20);
      gen_helper_store_msr(tcg_ctx,tcg_ctx->cpu_env,ret);
    }
    else {
      ret_00 = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_andi_i64_ppc64
                (tcg_ctx,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),
                 0x8002);
      tcg_gen_andi_i64_ppc64(tcg_ctx,ret_00,cpu_msr,-0x8003);
      tcg_gen_or_i64_ppc64(tcg_ctx,ret_00,ret_00,ret);
      gen_helper_store_msr(tcg_ctx,tcg_ctx->cpu_env,ret_00);
      tcg_temp_free_internal_ppc64(tcg_ctx,ts);
      ts = (TCGTemp *)(ret_00 + (long)tcg_ctx);
    }
    tcg_temp_free_internal_ppc64(tcg_ctx,ts);
    gen_stop_exception(ctx);
    return;
  }
  gen_priv_exception(ctx,1);
  return;
}

Assistant:

static void gen_mtmsr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;

    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    if (ctx->opcode & 0x00010000) {
        /* L=1 form only updates EE and RI */
        TCGv t0 = tcg_temp_new(tcg_ctx);
        TCGv t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)],
                        (1 << MSR_RI) | (1 << MSR_EE));
        tcg_gen_andi_tl(tcg_ctx, t1, cpu_msr,
                        ~(target_ulong)((1 << MSR_RI) | (1 << MSR_EE)));
        tcg_gen_or_tl(tcg_ctx, t1, t1, t0);

        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, t1);
        tcg_temp_free(tcg_ctx, t0);
        tcg_temp_free(tcg_ctx, t1);

    } else {
        TCGv msr = tcg_temp_new(tcg_ctx);

        /*
         * XXX: we need to update nip before the store if we enter
         *      power saving mode, we will exit the loop directly from
         *      ppc_store_msr
         */
        gen_update_nip(ctx, ctx->base.pc_next);
#if defined(TARGET_PPC64)
        tcg_gen_deposit_tl(tcg_ctx, msr, cpu_msr, cpu_gpr[rS(ctx->opcode)], 0, 32);
#else
        tcg_gen_mov_tl(tcg_ctx, msr, cpu_gpr[rS(ctx->opcode)]);
#endif
        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, msr);
        tcg_temp_free(tcg_ctx, msr);
    }
    /* Must stop the translation as machine state (may have) changed */
    gen_stop_exception(ctx);
}